

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitonicsort.hpp
# Opt level: O3

void mxx::impl::
     bitonic_split<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,MxxSort_StableSort_Test::TestBody()::__0>
               (pointer begin,pointer end,long param_3,int param_4,int param_5)

{
  long lVar1;
  pointer ppVar2;
  pointer ppVar3;
  undefined4 *puVar4;
  undefined4 *puVar5;
  undefined4 *puVar6;
  undefined4 *puVar7;
  pointer ppVar8;
  pointer ppVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> merge_buf;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> recv_buf;
  datatype dt;
  
  lVar13 = (long)end - (long)begin;
  uVar12 = lVar13 >> 3;
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            (&recv_buf,uVar12,(allocator_type *)&merge_buf);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            (&merge_buf,uVar12,(allocator_type *)&dt);
  dt.mpitype = datatype_builder<std::pair<int,_int>_>::get_type();
  dt._vptr_datatype = (_func_int **)&PTR__datatype_0017fc80;
  dt.builtin = false;
  MPI_Sendrecv(begin,uVar12 & 0xffffffff,dt.mpitype,param_4,0,
               recv_buf.
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start,uVar12,dt.mpitype,param_4,0,
               *(undefined8 *)(param_3 + 8),0);
  if (param_5 == 1) {
    if (*(int *)(param_3 + 0x14) <= param_4) goto LAB_001305ef;
  }
  else if ((param_5 != 0) || (param_4 <= *(int *)(param_3 + 0x14))) {
LAB_001305ef:
    lVar11 = (long)end - (long)begin;
    if (lVar11 != 0) {
      lVar1 = 0;
      puVar4 = (undefined4 *)
               ((long)recv_buf.
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar13 + -8);
      puVar6 = (undefined4 *)((long)begin + lVar13 + -8);
      do {
        iVar10 = puVar6[1];
        if (iVar10 < (int)puVar4[1]) {
          puVar5 = puVar4 + -2;
          puVar7 = puVar6;
          puVar6 = puVar4;
          iVar10 = puVar4[1];
        }
        else {
          puVar7 = puVar6 + -2;
          puVar5 = puVar4;
        }
        *(undefined4 *)
         ((long)merge_buf.
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_start + lVar1 * 8 + lVar11 + -8) = *puVar6;
        *(int *)((long)merge_buf.
                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar1 * 8 + lVar11 + -4) = iVar10
        ;
        lVar1 = lVar1 + -1;
        puVar4 = puVar5;
        puVar6 = puVar7;
      } while (-(ulong)(uVar12 == 0) - uVar12 != lVar1);
    }
    goto LAB_00130657;
  }
  if (end != begin) {
    lVar13 = 0;
    ppVar2 = recv_buf.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppVar8 = begin;
    do {
      iVar10 = ppVar2->second;
      if (ppVar8->second < iVar10) {
        ppVar3 = ppVar2;
        ppVar9 = ppVar8 + 1;
        ppVar2 = ppVar8;
        iVar10 = ppVar8->second;
      }
      else {
        ppVar3 = ppVar2 + 1;
        ppVar9 = ppVar8;
      }
      merge_buf.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start[lVar13].first = ppVar2->first;
      merge_buf.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start[lVar13].second = iVar10;
      lVar13 = lVar13 + 1;
      ppVar2 = ppVar3;
      ppVar8 = ppVar9;
    } while (uVar12 + (uVar12 == 0) != lVar13);
  }
LAB_00130657:
  lVar13 = (long)merge_buf.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)merge_buf.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 3;
  if (0 < lVar13) {
    uVar12 = lVar13 + 1;
    lVar13 = 0;
    do {
      *(undefined8 *)((long)&begin->first + lVar13) =
           *(undefined8 *)
            ((long)&(merge_buf.
                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                     _M_impl.super__Vector_impl_data._M_start)->first + lVar13);
      uVar12 = uVar12 - 1;
      lVar13 = lVar13 + 8;
    } while (1 < uVar12);
  }
  datatype::~datatype(&dt);
  if (merge_buf.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(merge_buf.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)merge_buf.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)merge_buf.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (recv_buf.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(recv_buf.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)recv_buf.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)recv_buf.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void bitonic_split(_Iterator begin, _Iterator end, _Compare comp, const mxx::comm& comm, int partner, int dir) {
    typedef typename std::iterator_traits<_Iterator>::value_type T;
    size_t np = std::distance(begin, end);
    //std::cout << "[Rank " << comm.rank() << "]: split with partner= " << partner << ", dir=" << dir << std::endl;
    std::vector<T> recv_buf(np);
    std::vector<T> merge_buf(np);

    // send/recv
    mxx::datatype dt = mxx::get_datatype<T>();
    MPI_Sendrecv(&*begin, np, dt.type(), partner, 0,
                 &recv_buf[0], np, dt.type(), partner, 0, comm, MPI_STATUS_IGNORE);

    // merge in `dir` direction into merge buffer
    if ((dir == asc && partner > comm.rank()) || (dir == desc && partner < comm.rank())) {
        // forward merge and keep the `np` smaller elements
        _Iterator l = begin;
        typename std::vector<T>::iterator r = recv_buf.begin();
        typename std::vector<T>::iterator o = merge_buf.begin();

        for (size_t i = 0; i < np; ++i) {
            if (comp(*l, *r)) {
                *o = *l;
                ++o;
                ++l;
            } else {
                *o = *r;
                ++o;
                ++r;
            }
        }
    } else {
        // backward merge and keep the `np` larger elements
        _Iterator l = begin+np-1;
        typename std::vector<T>::iterator r = recv_buf.begin()+np-1;
        typename std::vector<T>::iterator o = merge_buf.begin()+np-1;

        for (size_t i = 0; i < np; ++i) {
            if (comp(*l, *r)) {
                *o = *r;
                --o;
                --r;
            } else {
                *o = *l;
                --o;
                --l;
            }
        }
    }
    // copy results into local buffer
    std::copy(merge_buf.begin(), merge_buf.end(), begin);
}